

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O1

void glmc_rotate_make(vec4 *m,float angle,float *axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar1 = cosf(angle);
  fVar2 = axis[2] * axis[2] + *axis * *axis + axis[1] * axis[1];
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar6 = 0.0;
  fVar4 = 0.0;
  fVar5 = 0.0;
  if (1.1920929e-07 <= fVar2) {
    fVar2 = 1.0 / fVar2;
    fVar4 = fVar2 * (float)*(undefined8 *)axis;
    fVar5 = fVar2 * (float)((ulong)*(undefined8 *)axis >> 0x20);
    fVar6 = fVar2 * axis[2];
  }
  fVar7 = 1.0 - fVar1;
  fVar2 = fVar7 * fVar4;
  fVar8 = fVar7 * fVar5;
  fVar7 = fVar7 * fVar6;
  fVar3 = sinf(angle);
  *(ulong *)m[1] = CONCAT44(fVar8 * fVar5,fVar8 * fVar4);
  m[1][2] = fVar6 * fVar8;
  *(ulong *)m[2] = CONCAT44(fVar7 * fVar5,fVar7 * fVar4);
  m[1][0] = fVar8 * fVar4 - fVar3 * fVar6;
  m[2][0] = fVar7 * fVar4 + fVar5 * fVar3;
  *(ulong *)*m = CONCAT44(fVar3 * fVar6 + fVar2 * fVar5,fVar1 + fVar2 * fVar4);
  m[2][1] = m[2][1] - fVar4 * fVar3;
  (*m)[2] = fVar2 * fVar6 - fVar5 * fVar3;
  *(ulong *)(m[1] + 1) =
       CONCAT44(fVar4 * fVar3 + (float)((ulong)*(undefined8 *)(m[1] + 1) >> 0x20),
                fVar1 + (float)*(undefined8 *)(m[1] + 1));
  m[2][2] = fVar6 * fVar7 + fVar1;
  m[1][3] = 0.0;
  (*m)[3] = 0.0;
  *(undefined8 *)(m[2] + 3) = 0;
  *(float *)((long)(m + 3) + 4) = 0.0;
  *(float *)((long)(m + 3) + 8) = 0.0;
  m[3][3] = 1.0;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotate_make(mat4 m, float angle, vec3 axis) {
  glm_rotate_make(m, angle, axis);
}